

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void P_FireWeapon(player_t *player,FState *state)

{
  AWeapon *this;
  bool bVar1;
  AWeapon *weapon;
  FState *state_local;
  player_t *player_local;
  
  bVar1 = TObjPtr<DBot>::operator==(&player->Bot,(DBot *)0x0);
  if ((((!bVar1) || (bVar1 = FBoolCVar::operator_cast_to_bool(&bot_observer), !bVar1)) &&
      (this = player->ReadyWeapon, this != (AWeapon *)0x0)) &&
     (bVar1 = AWeapon::CheckAmmo(this,0,true,false,-1), bVar1)) {
    APlayerPawn::PlayAttacking(player->mo);
    this->bAltFire = false;
    weapon = (AWeapon *)state;
    if (state == (FState *)0x0) {
      weapon = (AWeapon *)AWeapon::GetAtkState(this,player->refire != 0);
    }
    P_SetPsprite(player,PSP_WEAPON,(FState *)weapon,false);
    if ((*(uint *)&(this->super_AStateProvider).super_AInventory.field_0x4fc & 0x10) == 0) {
      P_NoiseAlert(&player->mo->super_AActor,&player->mo->super_AActor,false,0.0);
    }
  }
  return;
}

Assistant:

void P_FireWeapon (player_t *player, FState *state)
{
	AWeapon *weapon;

	// [SO] 9/2/02: People were able to do an awful lot of damage
	// when they were observers...
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}

	weapon = player->ReadyWeapon;
	if (weapon == nullptr || !weapon->CheckAmmo (AWeapon::PrimaryFire, true))
	{
		return;
	}

	player->mo->PlayAttacking ();
	weapon->bAltFire = false;
	if (state == nullptr)
	{
		state = weapon->GetAtkState(!!player->refire);
	}
	P_SetPsprite(player, PSP_WEAPON, state);
	if (!(weapon->WeaponFlags & WIF_NOALERT))
	{
		P_NoiseAlert (player->mo, player->mo, false);
	}
}